

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void prvTidyCheckUrl(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char *pcVar1;
  char cVar2;
  byte *str;
  bool bVar3;
  Node *node_00;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  tmbstr ptVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ctmbstr s1;
  byte bVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  uint c;
  uint local_4c;
  AttVal *local_48;
  Node *local_40;
  byte *local_38;
  
  if ((attval == (AttVal *)0x0) || (s1 = attval->value, s1 == (ctmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
    return;
  }
  local_40 = node;
  iVar4 = prvTidytmbstrncmp(s1,"javascript:",0xb);
  iVar9 = 0;
  iVar10 = 0;
  uVar13 = 0;
  do {
    cVar2 = s1[uVar13];
    if (cVar2 == '\\') {
      iVar10 = iVar10 + 1;
      if (*(int *)((doc->config).value + 0x1b) != 0 && iVar4 != 0) {
        s1[uVar13] = '/';
      }
    }
    else {
      if (cVar2 == '\0') break;
      if (((byte)(cVar2 + 0x81U) < 0xa2) ||
         (pvVar6 = memchr("<>",(int)cVar2,3), pvVar6 != (void *)0x0)) {
        iVar9 = iVar9 + 1;
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
  if (*s1 == '\0') {
    bVar16 = true;
  }
  else {
    iVar14 = 0;
    do {
      uVar5 = prvTidyGetUTF8(s1,&local_4c);
      uVar13 = 0;
      if ((((((0x19 < (local_4c & 0xffffffdf) - 0x41) &&
             (uVar11 = local_4c & 0xfffcfffe, 0xfffd < uVar11 - 0xc0000)) &&
            (0xfffd < uVar11 - 0x80000)) &&
           ((0xfffd < uVar11 - 0x40000 && (0xfffd < (local_4c & 0xfffefffe) - 0x20000)))) &&
          ((((0xfffd < local_4c - 0x10000 &&
             ((0x1ff < local_4c - 0xfdf0 && (0x1dcf < local_4c - 0xe000)))) &&
            (0xd75f < local_4c - 0xa0)) &&
           ((((local_4c != 0x7e && (local_4c != 0x5f)) && (local_4c != 0x40)) &&
            (((uVar11 = local_4c & 0xfffffffd, uVar11 != 0x3d && ((local_4c & 0xfffffffe) != 0x3a))
             && ((8 < local_4c - 0x27 && ((uVar11 != 0x24 && (uVar11 != 0x21)))))))))))) &&
         ((local_4c != 0x25 && (9 < local_4c - 0x30)))) {
        uVar13 = (uint)(local_4c - 0x10fffe < 0xffff0002);
      }
      iVar14 = iVar14 + uVar13;
      pcVar1 = s1 + (uVar5 + 1);
      s1 = s1 + (uVar5 + 1);
    } while (*pcVar1 != '\0');
    bVar16 = iVar14 == 0;
  }
  if (iVar9 != 0 && *(int *)((doc->config).value + 0x1d) != 0) {
    str = (byte *)attval->value;
    uVar5 = prvTidytmbstrlen((ctmbstr)str);
    ptVar7 = (tmbstr)(*doc->allocator->vtbl->alloc)
                               (doc->allocator,(long)uVar5 + (long)iVar9 * 2 + 1);
    bVar12 = *str;
    uVar8 = 0;
    local_38 = str;
    if (bVar12 != 0) {
      uVar15 = 1;
      bVar3 = false;
      uVar8 = 0;
      local_48 = attval;
      do {
        if (((byte)(bVar12 + 0x81) < 0xa2) ||
           (pvVar6 = memchr("<>",(uint)bVar12,3), pvVar6 != (void *)0x0)) {
          if ((bVar12 != 0x20) || (bVar3)) {
            iVar14 = sprintf(ptVar7 + uVar8,"%%%02X",(ulong)bVar12);
            uVar13 = (int)uVar8 + iVar14;
            goto LAB_0013b77a;
          }
          bVar3 = false;
        }
        else {
          uVar13 = (int)uVar8 + 1;
          ptVar7[uVar8] = bVar12;
LAB_0013b77a:
          uVar8 = (ulong)uVar13;
          bVar3 = true;
        }
        bVar12 = local_38[uVar15];
        uVar15 = (ulong)((int)uVar15 + 1);
        attval = local_48;
      } while (bVar12 != 0);
    }
    ptVar7[uVar8] = '\0';
    (*doc->allocator->vtbl->free)(doc->allocator,attval->value);
    attval->value = ptVar7;
  }
  node_00 = local_40;
  if (iVar10 != 0) {
    uVar5 = 0x240;
    if (iVar4 == 0) {
      uVar5 = 0x229;
    }
    if (*(int *)((doc->config).value + 0x1b) == 0) {
      uVar5 = 0x229;
    }
    prvTidyReportAttrError(doc,local_40,attval,uVar5);
  }
  if (iVar9 == 0) goto LAB_0013b846;
  uVar5 = 0x23c;
  if (*(int *)((doc->config).value + 0x1d) == 0) {
    uVar13 = prvTidyHTMLVersion(doc);
    if ((uVar13 & 0x60000) == 0) {
      uVar5 = 0x245;
      goto LAB_0013b81d;
    }
  }
  else {
LAB_0013b81d:
    prvTidyReportAttrError(doc,node_00,attval,uVar5);
  }
  *(byte *)&doc->badChars = (byte)doc->badChars | 0x20;
LAB_0013b846:
  if (!bVar16) {
    prvTidyReportAttrError(doc,node_00,attval,0x244);
  }
  return;
}

Assistant:

void TY_(CheckUrl)( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbchar c;
    tmbstr dest, p;
    uint escape_count = 0, backslash_count = 0, bad_codepoint_count = 0;
    uint i, pos = 0;
    uint len;
    uint increment;
    Bool isJavascript = no;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    p = attval->value;

    isJavascript =
        TY_(tmbstrncmp)(p,"javascript:",sizeof("javascript:")-1)==0;

    for (i = 0; '\0' != (c = p[i]); ++i)
    {
        if (c == '\\')
        {
            ++backslash_count;
            if ( cfgBool(doc, TidyFixBackslash) && !isJavascript)
                p[i] = '/';
        }
        else if ((c > 0x7e) || (c <= 0x20) || (strchr("<>", c)))
            ++escape_count;
    }

    while ( *p != 0 )
    {
        if ( !IsURLCodePoint( p, &increment ) )
            ++bad_codepoint_count;
         p = p + increment;
    }
    p = attval->value;

    if ( cfgBool(doc, TidyFixUri) && escape_count )
    {
        Bool hadnonspace = no;
        len = TY_(tmbstrlen)(p) + escape_count * 2 + 1;
        dest = (tmbstr) TidyDocAlloc(doc, len);
 
        for (i = 0; 0 != (c = p[i]); ++i)
        {
            if ((c > 0x7e) || (c <= 0x20) || (strchr("<>", c)))
            {
                if (c == 0x20)
                {
                    /* #345 - special case for leading spaces - discard */
                    if (hadnonspace)
                        pos += sprintf( dest + pos, "%%%02X", (byte)c );
                }
                else
                {
                    pos += sprintf( dest + pos, "%%%02X", (byte)c );
                    hadnonspace = yes;
                }
            }
            else
            {
                hadnonspace = yes;
                dest[pos++] = c;
            }
        }
        dest[pos] = 0;

        TidyDocFree(doc, attval->value);
        attval->value = dest;
    }
    if ( backslash_count )
    {
        if ( cfgBool(doc, TidyFixBackslash) && !isJavascript )
            TY_(ReportAttrError)( doc, node, attval, FIXED_BACKSLASH );
        else
            TY_(ReportAttrError)( doc, node, attval, BACKSLASH_IN_URI );
    }
    if ( escape_count )
    {
        if ( cfgBool(doc, TidyFixUri) )
            TY_(ReportAttrError)( doc, node, attval, ESCAPED_ILLEGAL_URI);
        else if ( !(TY_(HTMLVersion)(doc) & VERS_HTML5) )
            TY_(ReportAttrError)( doc, node, attval, ILLEGAL_URI_REFERENCE);

        doc->badChars |= BC_INVALID_URI;
    }
    if ( bad_codepoint_count )
    {
        TY_(ReportAttrError)( doc, node, attval, ILLEGAL_URI_CODEPOINT );
    }
}